

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O0

int Gia_ObjComputeEdgeDelay2
              (Gia_Man_t *p,int iObj,Vec_Int_t *vDelay,Vec_Int_t *vEdge1,Vec_Int_t *vEdge2,
              Vec_Int_t *vFanMax1,Vec_Int_t *vFanMax2,Vec_Int_t *vCountMax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int iFanMax2;
  int iFanMax1;
  int nCountMax;
  int DelayMax;
  int Status2;
  int Status1;
  int DelayFanin;
  int iFan;
  int i;
  Vec_Int_t *vFanMax1_local;
  Vec_Int_t *vEdge2_local;
  Vec_Int_t *vEdge1_local;
  Vec_Int_t *vDelay_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  Vec_IntWriteEntry(vEdge1,iObj,0);
  Vec_IntWriteEntry(vEdge2,iObj,0);
  iFanMax1 = Vec_IntEntry(vDelay,iObj);
  iVar1 = Vec_IntEntry(vCountMax,iObj);
  if (iFanMax1 != 0) {
    if (iVar1 == 1) {
      iVar1 = Vec_IntEntry(vFanMax1,iObj);
      iVar4 = Gia_ObjEdgeCount(iVar1,vEdge1,vEdge2);
      if (iVar4 < 2) {
        Gia_ObjEdgeAdd(iVar1,iObj,vEdge1,vEdge2);
        Gia_ObjEdgeAdd(iObj,iVar1,vEdge1,vEdge2);
        iFanMax1 = iFanMax1 + -1;
      }
    }
    else if (iVar1 == 2) {
      iVar1 = Vec_IntEntry(vFanMax1,iObj);
      iVar4 = Vec_IntEntry(vFanMax2,iObj);
      iVar2 = Gia_ObjEdgeCount(iVar1,vEdge1,vEdge2);
      iVar3 = Gia_ObjEdgeCount(iVar4,vEdge1,vEdge2);
      if ((iVar2 < 2) && (iVar3 < 2)) {
        Gia_ObjEdgeAdd(iVar1,iObj,vEdge1,vEdge2);
        Gia_ObjEdgeAdd(iVar4,iObj,vEdge1,vEdge2);
        Gia_ObjEdgeAdd(iObj,iVar1,vEdge1,vEdge2);
        Gia_ObjEdgeAdd(iObj,iVar4,vEdge1,vEdge2);
        iFanMax1 = iFanMax1 + -1;
      }
    }
  }
  Vec_IntWriteEntry(vDelay,iObj,iFanMax1);
  iVar1 = Gia_ManHasMapping(p);
  if ((iVar1 == 0) || (iVar1 = Gia_ObjIsLut(p,iObj), iVar1 == 0)) {
    iVar1 = Gia_ObjIsLut2(p,iObj);
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                    ,0x235,
                    "int Gia_ObjComputeEdgeDelay2(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    for (DelayFanin = 0; iVar1 = Gia_ObjLutSize2(p,iObj), DelayFanin < iVar1;
        DelayFanin = DelayFanin + 1) {
      iVar1 = Gia_ObjLutFanin2(p,iObj,DelayFanin);
      iVar4 = Vec_IntEntry(vDelay,iVar1);
      if (iVar4 < iFanMax1 + 1) {
        Vec_IntWriteEntry(vDelay,iVar1,iFanMax1 + 1);
        Vec_IntWriteEntry(vFanMax1,iVar1,iObj);
        Vec_IntWriteEntry(vCountMax,iVar1,1);
      }
      else if (iVar4 == iFanMax1 + 1) {
        Vec_IntWriteEntry(vFanMax2,iVar1,iObj);
        Vec_IntAddToEntry(vCountMax,iVar1,1);
      }
    }
  }
  else {
    for (DelayFanin = 0; iVar1 = Gia_ObjLutSize(p,iObj), DelayFanin < iVar1;
        DelayFanin = DelayFanin + 1) {
      piVar5 = Gia_ObjLutFanins(p,iObj);
      iVar1 = piVar5[DelayFanin];
      iVar4 = Vec_IntEntry(vDelay,iVar1);
      if (iVar4 < iFanMax1 + 1) {
        Vec_IntWriteEntry(vDelay,iVar1,iFanMax1 + 1);
        Vec_IntWriteEntry(vFanMax1,iVar1,iObj);
        Vec_IntWriteEntry(vCountMax,iVar1,1);
      }
      else if (iVar4 == iFanMax1 + 1) {
        Vec_IntWriteEntry(vFanMax2,iVar1,iObj);
        Vec_IntAddToEntry(vCountMax,iVar1,1);
      }
    }
  }
  return iFanMax1;
}

Assistant:

int Gia_ObjComputeEdgeDelay2( Gia_Man_t * p, int iObj, Vec_Int_t * vDelay, Vec_Int_t * vEdge1, Vec_Int_t * vEdge2, Vec_Int_t * vFanMax1, Vec_Int_t * vFanMax2, Vec_Int_t * vCountMax )
{
    int i, iFan, DelayFanin, Status1, Status2;
    int DelayMax = 0, nCountMax = 0;
    int iFanMax1 = -1, iFanMax2 = -1;
    Vec_IntWriteEntry(vEdge1, iObj, 0);
    Vec_IntWriteEntry(vEdge2, iObj, 0);
    // analyze this node
    DelayMax = Vec_IntEntry( vDelay, iObj );
    nCountMax = Vec_IntEntry( vCountMax, iObj );
    if ( DelayMax == 0 )
    {}
    else if ( nCountMax == 1 )
    {
        iFanMax1 = Vec_IntEntry( vFanMax1, iObj );
        Status1 = Gia_ObjEdgeCount( iFanMax1, vEdge1, vEdge2 );
        if ( Status1 <= 1 )
        {
            Gia_ObjEdgeAdd( iFanMax1, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax1, vEdge1, vEdge2 );
            DelayMax--;
        }
    }
    else if ( nCountMax == 2 )
    {
        iFanMax1 = Vec_IntEntry( vFanMax1, iObj );
        iFanMax2 = Vec_IntEntry( vFanMax2, iObj );
        Status1 = Gia_ObjEdgeCount( iFanMax1, vEdge1, vEdge2 );
        Status2 = Gia_ObjEdgeCount( iFanMax2, vEdge1, vEdge2 );
        if ( Status1 <= 1 && Status2 <= 1 )
        {
            Gia_ObjEdgeAdd( iFanMax1, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iFanMax2, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax1, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax2, vEdge1, vEdge2 );
            DelayMax--;
        }
    }
    Vec_IntWriteEntry( vDelay, iObj, DelayMax );
    // computed DelayMax at this point
    if ( Gia_ManHasMapping(p) && Gia_ObjIsLut(p, iObj) )
    {
        Gia_LutForEachFanin( p, iObj, iFan, i )
        {
            DelayFanin = Vec_IntEntry( vDelay, iFan );
            if ( DelayFanin < DelayMax + 1 )
            {
                Vec_IntWriteEntry( vDelay, iFan, DelayMax + 1 );
                Vec_IntWriteEntry( vFanMax1, iFan, iObj );
                Vec_IntWriteEntry( vCountMax, iFan, 1 );
            }
            else if ( DelayFanin == DelayMax + 1 )
            {
                Vec_IntWriteEntry( vFanMax2, iFan, iObj );
                Vec_IntAddToEntry( vCountMax, iFan, 1 );
            }
        }
    }
    else if ( Gia_ObjIsLut2(p, iObj) )
    {
        Gia_LutForEachFanin2( p, iObj, iFan, i )
        {
            DelayFanin = Vec_IntEntry( vDelay, iFan );
            if ( DelayFanin < DelayMax + 1 )
            {
                Vec_IntWriteEntry( vDelay, iFan, DelayMax + 1 );
                Vec_IntWriteEntry( vFanMax1, iFan, iObj );
                Vec_IntWriteEntry( vCountMax, iFan, 1 );
            }
            else if ( DelayFanin == DelayMax + 1 )
            {
                Vec_IntWriteEntry( vFanMax2, iFan, iObj );
                Vec_IntAddToEntry( vCountMax, iFan, 1 );
            }
        }
    }
    else assert( 0 );
    return DelayMax;
}